

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
               (ParamsStream<DataStream_&,_TransactionSerParams> *is,
               shared_ptr<const_CTransaction> *p)

{
  long in_FS_OFFSET;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  make_shared<CTransaction_const,deserialize_type_const&,ParamsStream<DataStream&,TransactionSerParams>&>
            ((deserialize_type *)&_Stack_28,
             (ParamsStream<DataStream_&,_TransactionSerParams> *)&deserialize);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&p->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::shared_ptr<const T>& p)
{
    p = std::make_shared<const T>(deserialize, is);
}